

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O0

int Mvc_CoverSupportVarBelongs(Mvc_Cover_t *pCover,int iVar)

{
  Mvc_Cube_t *pSupp_00;
  byte local_2d;
  int v1;
  int v0;
  int RetValue;
  Mvc_Cube_t *pSupp;
  int iVar_local;
  Mvc_Cover_t *pCover_local;
  
  pSupp_00 = Mvc_CubeAlloc(pCover);
  Mvc_CoverSupportAnd(pCover,pSupp_00);
  local_2d = 1;
  if ((pSupp_00->pData[(iVar << 1) >> 5] & 1 << ((byte)(iVar << 1) & 0x1f)) != 0) {
    local_2d = (pSupp_00->pData[iVar * 2 + 1 >> 5] & 1 << ((char)iVar * '\x02' + 1U & 0x1f)) != 0 ^
               0xff;
  }
  Mvc_CubeFree(pCover,pSupp_00);
  return (uint)(local_2d & 1);
}

Assistant:

int Mvc_CoverSupportVarBelongs( Mvc_Cover_t * pCover, int iVar )
{
    Mvc_Cube_t * pSupp;
    int RetValue, v0, v1;
    // compute the support
    pSupp = Mvc_CubeAlloc( pCover );
    Mvc_CoverSupportAnd( pCover, pSupp );
    v0 = Mvc_CubeBitValue( pSupp, 2*iVar   );
    v1 = Mvc_CubeBitValue( pSupp, 2*iVar+1 );
    RetValue = (int)( !v0 || !v1 );
    Mvc_CubeFree( pCover, pSupp );
    return RetValue;
}